

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_font(_glist *x,t_floatarg font,t_floatarg resize,t_floatarg whichresize)

{
  int font_00;
  _glist *x_00;
  void *data;
  int oldfont;
  _glist *x2;
  t_float realresy;
  t_float realresx;
  t_float realresize;
  t_floatarg whichresize_local;
  t_floatarg resize_local;
  t_floatarg font_local;
  _glist *x_local;
  
  x2._4_4_ = 1.0;
  x2._0_4_ = 1.0;
  x_00 = canvas_getrootfor(x);
  font_00 = x_00->gl_font;
  if ((resize != 0.0) || (NAN(resize))) {
    realresize = resize;
    if (resize < 20.0) {
      realresize = 20.0;
    }
    if (500.0 < realresize) {
      realresize = 500.0;
    }
    realresy = realresize * 0.01;
  }
  else {
    realresy = 1.0;
  }
  if ((whichresize != 3.0) || (NAN(whichresize))) {
    x2._4_4_ = realresy;
  }
  if ((whichresize != 2.0) || (NAN(whichresize))) {
    x2._0_4_ = realresy;
  }
  canvas_dofont(x_00,font,x2._4_4_,x2._0_4_);
  data = canvas_undo_set_font(x_00,font_00,realresy,(int)whichresize);
  canvas_undo_add(x_00,UNDO_FONT,"font",data);
  sys_defaultfont = (int)font;
  return;
}

Assistant:

static void canvas_font(t_canvas *x, t_floatarg font, t_floatarg resize,
    t_floatarg whichresize)
{
    t_float realresize, realresx = 1, realresy = 1;
    t_canvas *x2 = canvas_getrootfor(x);
    int oldfont = x2->gl_font;
    if (!resize) realresize = 1;
    else
    {
        if (resize < 20) resize = 20;
        if (resize > 500) resize = 500;
        realresize = resize * 0.01;
    }
    if (whichresize != 3) realresx = realresize;
    if (whichresize != 2) realresy = realresize;
    canvas_dofont(x2, font, realresx, realresy);
    canvas_undo_add(x2, UNDO_FONT, "font",
        canvas_undo_set_font(x2, oldfont, realresize, whichresize));

    sys_defaultfont = font;
}